

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O3

CURLcode Curl_ntlm_core_mk_nt_hash(char *password,uchar *ntbuffer)

{
  CURLcode CVar1;
  size_t i;
  size_t sVar2;
  uchar *input;
  size_t sVar3;
  
  sVar2 = strlen(password);
  CVar1 = CURLE_OUT_OF_MEMORY;
  if (-1 < (long)sVar2) {
    if (sVar2 == 0) {
      input = (uchar *)(*Curl_cstrdup)("");
      if (input == (uchar *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    else {
      input = (uchar *)(*Curl_cmalloc)(sVar2 * 2);
      if (input == (uchar *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      sVar3 = 0;
      do {
        input[sVar3 * 2] = password[sVar3];
        input[sVar3 * 2 + 1] = '\0';
        sVar3 = sVar3 + 1;
      } while (sVar2 != sVar3);
    }
    CVar1 = Curl_md4it(ntbuffer,input,sVar2 * 2);
    if (CVar1 == CURLE_OK) {
      ntbuffer[0x14] = '\0';
      ntbuffer[0x10] = '\0';
      ntbuffer[0x11] = '\0';
      ntbuffer[0x12] = '\0';
      ntbuffer[0x13] = '\0';
    }
    (*Curl_cfree)(input);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_ntlm_core_mk_nt_hash(const char *password,
                                   unsigned char *ntbuffer /* 21 bytes */)
{
  size_t len = strlen(password);
  unsigned char *pw;
  CURLcode result;
  if(len > SIZE_T_MAX/2) /* avoid integer overflow */
    return CURLE_OUT_OF_MEMORY;
  pw = len ? malloc(len * 2) : (unsigned char *)strdup("");
  if(!pw)
    return CURLE_OUT_OF_MEMORY;

  ascii_to_unicode_le(pw, password, len);

  /* Create NT hashed password. */
  result = Curl_md4it(ntbuffer, pw, 2 * len);
  if(!result)
    memset(ntbuffer + 16, 0, 21 - 16);

  free(pw);

  return result;
}